

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

bool spvtools::utils::
     RejectParseDueToLeadingSign<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>
               (istream *is,bool negate_value,
               HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
               *value)

{
  FloatProxy<double> local_40;
  FloatProxy<double> local_38;
  int local_2c;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  *pHStack_28;
  int_type next_char;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  *value_local;
  istream *piStack_18;
  bool negate_value_local;
  istream *is_local;
  
  if ((negate_value) &&
     ((pHStack_28 = value, value_local._7_1_ = negate_value, piStack_18 = is,
      local_2c = std::istream::peek(), local_2c == 0x2d || (local_2c == 0x2b)))) {
    FloatProxy<double>::FloatProxy(&local_40,0);
    HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
    ::HexFloat((HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                *)&local_38,local_40);
    (pHStack_28->value_).data_ = local_38.data_;
    std::ios::setstate((int)piStack_18 + (int)*(undefined8 *)(*(long *)piStack_18 + -0x18));
    is_local._7_1_ = true;
  }
  else {
    is_local._7_1_ = false;
  }
  return is_local._7_1_;
}

Assistant:

inline bool RejectParseDueToLeadingSign(std::istream& is, bool negate_value,
                                        HexFloat<T, Traits>& value) {
  if (negate_value) {
    auto next_char = is.peek();
    if (next_char == '-' || next_char == '+') {
      // Fail the parse.  Emulate standard behaviour by setting the value to
      // the zero value, and set the fail bit on the stream.
      value = HexFloat<T, Traits>(typename HexFloat<T, Traits>::uint_type{0});
      is.setstate(std::ios_base::failbit);
      return true;
    }
  }
  return false;
}